

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

void __thiscall
OpenMD::DataStorage::internalResize<OpenMD::SquareMatrix3<double>>
          (DataStorage *this,
          vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *v,
          size_t newSize)

{
  iterator __first;
  ulong in_RDX;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *in_RSI;
  iterator i;
  size_t oldSize;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_ffffffffffffff18;
  __normal_iterator<const_OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
  *in_stack_ffffffffffffff20;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_ffffffffffffff38;
  const_iterator in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff58;
  __normal_iterator<OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
  local_98;
  SquareMatrix3<double> *local_90;
  SquareMatrix3<double> *local_30;
  size_type local_20;
  ulong local_18;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::
             vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
             ::size(in_RSI);
  if (local_20 != local_18) {
    if (local_20 < local_18) {
      local_30 = (SquareMatrix3<double> *)
                 std::
                 vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ::end(in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<OpenMD::SquareMatrix3<double>const*,std::vector<OpenMD::SquareMatrix3<double>,std::allocator<OpenMD::SquareMatrix3<double>>>>
      ::__normal_iterator<OpenMD::SquareMatrix3<double>*>
                ((__normal_iterator<const_OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
                  *)local_10,
                 (__normal_iterator<OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
                  *)in_stack_ffffffffffffff18);
      SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2e0437);
      local_90 = (SquareMatrix3<double> *)
                 std::
                 vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ::insert(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40._M_current);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2e046e);
    }
    else {
      __gnu_cxx::
      __normal_iterator<OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
      ::__normal_iterator(&local_98);
      local_98._M_current =
           (SquareMatrix3<double> *)
           std::
           vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
           begin(in_stack_ffffffffffffff18);
      std::
      advance<__gnu_cxx::__normal_iterator<OpenMD::SquareMatrix3<double>*,std::vector<OpenMD::SquareMatrix3<double>,std::allocator<OpenMD::SquareMatrix3<double>>>>,unsigned_long>
                ((__normal_iterator<OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
                  *)in_stack_ffffffffffffff40._M_current,(unsigned_long)in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<OpenMD::SquareMatrix3<double>const*,std::vector<OpenMD::SquareMatrix3<double>,std::allocator<OpenMD::SquareMatrix3<double>>>>
      ::__normal_iterator<OpenMD::SquareMatrix3<double>*>
                (in_stack_ffffffffffffff20,
                 (__normal_iterator<OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
                  *)local_10);
      __first = std::
                vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                ::end(local_10);
      __gnu_cxx::
      __normal_iterator<OpenMD::SquareMatrix3<double>const*,std::vector<OpenMD::SquareMatrix3<double>,std::allocator<OpenMD::SquareMatrix3<double>>>>
      ::__normal_iterator<OpenMD::SquareMatrix3<double>*>
                (in_stack_ffffffffffffff20,
                 (__normal_iterator<OpenMD::SquareMatrix3<double>_*,_std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
                  *)local_10);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      erase(in_stack_ffffffffffffff38,(const_iterator)__first._M_current,in_stack_ffffffffffffff40);
    }
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }